

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Annotation::Transform(ON_OBSOLETE_V5_Annotation *this,ON_Xform *xform)

{
  bool bVar1;
  int iVar2;
  ON_Plane *pOVar3;
  double dVar4;
  double d1;
  ON_2dPoint OVar5;
  int local_f4;
  undefined1 auStack_f0 [4];
  int i;
  ON_2dPoint p;
  ON_Xform xfscale;
  double sy;
  double sx;
  ON_3dVector vy;
  ON_3dVector vx;
  double tol;
  ON_Xform *xform_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  
  ON_Geometry::Transform(&this->super_ON_Geometry,xform);
  pOVar3 = Plane(this);
  vy.z = (pOVar3->xaxis).x;
  pOVar3 = Plane(this);
  sx = (pOVar3->yaxis).x;
  vy.x = (pOVar3->yaxis).y;
  vy.y = (pOVar3->yaxis).z;
  ON_3dVector::Transform((ON_3dVector *)&vy.z,xform);
  ON_3dVector::Transform((ON_3dVector *)&sx,xform);
  dVar4 = ON_3dVector::Length((ON_3dVector *)&vy.z);
  d1 = ON_3dVector::Length((ON_3dVector *)&sx);
  if (((0.0001 < ABS(dVar4 - 1.0)) && (0.0001 < ABS(dVar4))) ||
     ((0.0001 < ABS(d1 - 1.0) && (0.0001 < ABS(d1))))) {
    ON_Xform::DiagonalTransformation((ON_Xform *)&p.y,dVar4,d1,1.0);
    for (local_f4 = 0;
        iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                          (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>), local_f4 < iVar2;
        local_f4 = local_f4 + 1) {
      OVar5 = Point(this,local_f4);
      _auStack_f0 = OVar5.x;
      p.x = OVar5.y;
      ON_2dPoint::Transform((ON_2dPoint *)auStack_f0,(ON_Xform *)&p.y);
      SetPoint(this,local_f4,(ON_2dPoint *)auStack_f0);
    }
  }
  bVar1 = IsText(this);
  if (bVar1) {
    dVar4 = Height(this);
    SetHeight(this,d1 * dVar4);
  }
  bVar1 = ON_Plane::Transform(&this->m_plane,xform);
  return bVar1;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::Transform( const ON_Xform& xform )
{
  ON_Geometry::Transform(xform);
  const double tol = 1.0e-4;
  ON_3dVector vx = Plane().xaxis;
  ON_3dVector vy = Plane().yaxis;
  vx.Transform(xform);
  vy.Transform(xform);
  double sx = vx.Length();
  double sy = vy.Length();
  if ((fabs(sx - 1.0) > tol && fabs(sx) > tol) ||
      (fabs(sy - 1.0) > tol && fabs(sy) > tol))
  {
    ON_Xform xfscale(ON_Xform::DiagonalTransformation(sx, sy, 1.0));

    ON_2dPoint p;
    for (int i = 0; i < m_points.Count(); i++)
    {
      p = Point(i);
      p.Transform(xfscale);
      SetPoint(i, p);
    }
  }
  // This scales the text height on text but not on dimensions
  if (ON_OBSOLETE_V5_Annotation::IsText())
  {
    SetHeight(sy * Height());
  }

  return m_plane.Transform(xform);
}